

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ProcessMorphAnimDatas
          (FBXConverter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
          *morphAnimDatas,BlendShapeChannel *bsc,AnimationCurveNode *node)

{
  long lVar1;
  iterator __position;
  byte bVar2;
  _Alloc_hider _Var3;
  int iVar4;
  Object *pOVar5;
  long lVar6;
  __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
  _Var7;
  __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
  _Var8;
  iterator iVar9;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *p_Var10;
  AnimationCurveMap *pAVar11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *p_Var14;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  undefined8 uVar15;
  ulong uVar16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  char *pcVar19;
  pointer ppCVar20;
  size_t sVar21;
  long *plVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  uint channelIndex;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
  curvesIt;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  geoConnections;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bsConnections;
  Geometry *geo;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bscConnections;
  aiString name;
  uint local_554;
  string local_550;
  long local_530;
  string local_528;
  FBXConverter *local_508;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
  *local_500;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *local_4f8;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *local_4f0;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_4e8;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_4d0;
  pointer local_4b8;
  pointer local_4b0;
  pointer local_4a8;
  pointer local_4a0;
  _Base_ptr local_498;
  AnimationCurveNode *local_490;
  pointer local_488;
  pointer local_480;
  _Base_ptr local_478;
  _Base_ptr local_470;
  long *local_468;
  long local_460;
  BlendShapeChannel *local_458;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_450;
  uint local_434;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [64];
  
  local_508 = this;
  local_490 = node;
  local_458 = bsc;
  Document::GetConnectionsBySourceSequenced
            (&local_450,this->doc,(bsc->super_Deformer).super_Object.id,"Deformer");
  local_4b8 = local_450.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_498 = &(morphAnimDatas->_M_t)._M_impl.super__Rb_tree_header._M_header;
    ppCVar20 = local_450.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_500 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                 *)morphAnimDatas;
    do {
      local_4b0 = ppCVar20;
      pOVar5 = Connection::DestinationObject(*ppCVar20);
      if (((pOVar5 != (Object *)0x0) &&
          (lVar6 = __dynamic_cast(pOVar5,&Object::typeinfo,&BlendShape::typeinfo,0), lVar6 != 0)) &&
         (_Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::BlendShapeChannel_const*const*,std::vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::BlendShapeChannel_const*const>>
                            (*(undefined8 *)(lVar6 + 0x48),*(undefined8 *)(lVar6 + 0x50),&local_458)
         , _Var7._M_current != *(BlendShapeChannel ***)(lVar6 + 0x50))) {
        local_554 = (uint)((ulong)((long)_Var7._M_current - *(long *)(lVar6 + 0x48)) >> 3);
        Document::GetConnectionsBySourceSequenced
                  (&local_4d0,local_508->doc,*(uint64_t *)(lVar6 + 0x30),"Geometry");
        local_4a8 = local_4d0.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        ppCVar20 = local_4d0.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (local_4d0.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_4d0.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_4a0 = ppCVar20;
            pOVar5 = Connection::DestinationObject(*ppCVar20);
            if ((pOVar5 != (Object *)0x0) &&
               (local_460 = __dynamic_cast(pOVar5,&Object::typeinfo,&Geometry::typeinfo,0),
               local_460 != 0)) {
              Document::GetConnectionsBySourceSequenced
                        (&local_4e8,local_508->doc,*(uint64_t *)(local_460 + 0x30),"Model");
              local_488 = local_4e8.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              ppCVar20 = local_4e8.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              if (local_4e8.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_4e8.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  paVar18 = &local_550.field_2;
                  pOVar5 = Connection::DestinationObject(*ppCVar20);
                  local_480 = ppCVar20;
                  if ((pOVar5 != (Object *)0x0) &&
                     (lVar6 = __dynamic_cast(pOVar5,&Object::typeinfo,&Model::typeinfo,0),
                     lVar6 != 0)) {
                    _Var8 = std::
                            __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::Geometry_const*const*,std::vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::Geometry_const*const>>
                                      (*(undefined8 *)(lVar6 + 0x50),*(undefined8 *)(lVar6 + 0x58),
                                       &local_460);
                    lVar1 = *(long *)(lVar6 + 0x50);
                    local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_528,*(long *)(lVar6 + 0x10),
                               *(long *)(lVar6 + 0x18) + *(long *)(lVar6 + 0x10));
                    pcVar19 = "*";
                    std::__cxx11::string::append((char *)&local_528);
                    FixNodeName(&local_550,(FBXConverter *)pcVar19,&local_528);
                    _Var3._M_p = local_550._M_dataplus._M_p;
                    sVar21 = local_550._M_string_length & 0xffffffff;
                    if ((local_550._M_string_length & 0xfffffc00) != 0) {
                      sVar21 = 0x3ff;
                    }
                    local_434 = (uint)sVar21;
                    memcpy(local_430,local_550._M_dataplus._M_p,sVar21);
                    local_430[0]._M_local_buf[sVar21] = '\0';
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var3._M_p != paVar18) {
                      operator_delete(_Var3._M_p,local_550.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_528._M_dataplus._M_p != &local_528.field_2) {
                      operator_delete(local_528._M_dataplus._M_p,
                                      local_528.field_2._M_allocated_capacity + 1);
                    }
                    uVar23 = (ulong)((long)_Var8._M_current - lVar1) >> 3;
                    uVar16 = (ulong)local_434;
                    pcVar19 = local_430[0]._M_local_buf + uVar16;
                    local_434 = 1;
                    if ((int)uVar23 < 0) {
                      *pcVar19 = '-';
                      pcVar19 = local_430[0]._M_local_buf + uVar16 + 1;
                      uVar23 = (ulong)(uint)-(int)uVar23;
                      local_434 = 2;
                    }
                    iVar4 = 1000000000;
                    bVar2 = 0;
                    do {
                      uVar16 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
                      lVar6 = (long)uVar16 / (long)iVar4;
                      bVar24 = (int)lVar6 != 0;
                      bVar25 = iVar4 == 1;
                      if ((bool)(bVar2 | bVar25 | bVar24)) {
                        *pcVar19 = (char)lVar6 + '0';
                        pcVar19 = pcVar19 + 1;
                        local_434 = local_434 + 1;
                        uVar23 = (long)uVar16 % (long)iVar4 & 0xffffffff;
                        if (iVar4 == 1) break;
                      }
                      iVar4 = iVar4 / 10;
                      bVar2 = bVar2 | bVar25 | bVar24;
                    } while (local_434 < 0x3ff);
                    *pcVar19 = '\0';
                    local_550._M_dataplus._M_p = (pointer)paVar18;
                    sVar21 = strlen(local_430[0]._M_local_buf);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_550,local_430,local_430[0]._M_local_buf + sVar21);
                    iVar9 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                                    *)local_500,&local_550);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_550._M_dataplus._M_p != paVar18) {
                      operator_delete(local_550._M_dataplus._M_p,
                                      local_550.field_2._M_allocated_capacity + 1);
                    }
                    if (iVar9._M_node == local_498) {
                      p_Var10 = (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                 *)operator_new(0x30);
                      *(undefined8 *)(p_Var10 + 0x10) = 0;
                      *(undefined8 *)(p_Var10 + 0x18) = 0;
                      *(undefined8 *)p_Var10 = 0;
                      *(undefined8 *)(p_Var10 + 8) = 0;
                      *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                        **)(p_Var10 + 0x18) = p_Var10 + 8;
                      *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                        **)(p_Var10 + 0x20) = p_Var10 + 8;
                      *(undefined8 *)(p_Var10 + 0x28) = 0;
                      local_550._M_dataplus._M_p = (pointer)local_430;
                      local_550._M_string_length = (size_type)p_Var10;
                      std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                      ::
                      _M_emplace_unique<std::pair<char_const*,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>
                                (local_500,
                                 (pair<const_char_*,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
                                  *)&local_550);
                    }
                    else {
                      p_Var10 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                  **)(iVar9._M_node + 2);
                    }
                    pAVar11 = AnimationCurveNode::Curves_abi_cxx11_(local_490);
                    p_Var13 = (pAVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    p_Var12 = &(pAVar11->_M_t)._M_impl.super__Rb_tree_header;
                    if ((_Rb_tree_header *)p_Var13 != p_Var12) {
                      local_4f8 = p_Var10 + 8;
                      local_4f0 = p_Var10;
                      local_478 = &p_Var12->_M_header;
                      do {
                        local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_550,*(long *)(p_Var13 + 1),
                                   (long)&(p_Var13[1]._M_parent)->_M_color + *(long *)(p_Var13 + 1))
                        ;
                        local_530 = *(long *)(p_Var13 + 2);
                        local_470 = p_Var13;
                        iVar4 = std::__cxx11::string::compare((char *)&local_550);
                        lVar6 = local_530;
                        if (iVar4 == 0) {
                          plVar22 = *(long **)(local_530 + 0x38);
                          local_468 = *(long **)(local_530 + 0x40);
                          if (plVar22 != local_468) {
                            uVar17 = 0;
                            do {
                              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)*plVar22;
                              p_Var10 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                          **)(local_4f0 + 0x10);
                              p_Var14 = local_4f8;
                              if (p_Var10 ==
                                  (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                   *)0x0) {
LAB_005e1bc4:
                                this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                                          operator_new(0x30);
                                *(undefined8 *)(this_00 + 0x20) = 0;
                                *(undefined8 *)(this_00 + 0x28) = 0;
                                *(undefined8 *)(this_00 + 0x10) = 0;
                                *(undefined8 *)(this_00 + 0x18) = 0;
                                *(undefined8 *)this_00 = 0;
                                *(undefined8 *)(this_00 + 8) = 0;
                                local_528._M_dataplus._M_p = (pointer)paVar18;
                                local_528._M_string_length = (size_type)this_00;
                                std::
                                _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                ::_M_emplace_unique<std::pair<long,morphKeyData*>>
                                          (local_4f0,(pair<long,_morphKeyData_*> *)&local_528);
                              }
                              else {
                                do {
                                  if ((long)paVar18 <= *(long *)(p_Var10 + 0x20)) {
                                    p_Var14 = p_Var10;
                                  }
                                  p_Var10 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                              **)(p_Var10 +
                                                 (ulong)(*(long *)(p_Var10 + 0x20) < (long)paVar18)
                                                 * 8 + 0x10);
                                } while (p_Var10 !=
                                         (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                          *)0x0);
                                if ((p_Var14 == local_4f8) ||
                                   ((long)paVar18 < *(long *)(p_Var14 + 0x20))) goto LAB_005e1bc4;
                                this_00 = *(vector<unsigned_int,std::allocator<unsigned_int>> **)
                                           (p_Var14 + 0x28);
                              }
                              __position._M_current = *(uint **)(this_00 + 8);
                              if (__position._M_current == *(uint **)(this_00 + 0x10)) {
                                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                                _M_realloc_insert<unsigned_int_const&>
                                          (this_00,__position,&local_554);
                              }
                              else {
                                *__position._M_current = local_554;
                                *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
                              }
                              lVar1 = *(long *)(lVar6 + 0x50);
                              if ((ulong)(*(long *)(lVar6 + 0x58) - lVar1 >> 2) <= (ulong)uVar17) {
                                uVar15 = std::__throw_out_of_range_fmt
                                                   (
                                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                  );
                                if (local_450.
                                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_450.
                                                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_450.
                                                                                                                
                                                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_450.
                                                                                                                    
                                                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                _Unwind_Resume(uVar15);
                              }
                              local_528._M_dataplus._M_p._0_4_ =
                                   *(float *)(lVar1 + (ulong)uVar17 * 4) / 100.0;
                              std::vector<float,_std::allocator<float>_>::emplace_back<float>
                                        ((vector<float,_std::allocator<float>_> *)(this_00 + 0x18),
                                         (float *)&local_528);
                              uVar17 = uVar17 + 1;
                              plVar22 = plVar22 + 1;
                            } while (plVar22 != local_468);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_550._M_dataplus._M_p != &local_550.field_2) {
                          operator_delete(local_550._M_dataplus._M_p,
                                          local_550.field_2._M_allocated_capacity + 1);
                        }
                        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(local_470);
                      } while (p_Var13 != local_478);
                    }
                  }
                  ppCVar20 = local_480 + 1;
                } while (ppCVar20 != local_488);
              }
              if (local_4e8.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_4e8.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_4e8.
                                      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_4e8.
                                      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            ppCVar20 = local_4a0 + 1;
          } while (ppCVar20 != local_4a8);
        }
        if (local_4d0.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_4d0.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4d0.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      ppCVar20 = local_4b0 + 1;
    } while (ppCVar20 != local_4b8);
  }
  if (local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_450.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_450.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ProcessMorphAnimDatas(std::map<std::string, morphAnimData*>* morphAnimDatas, const BlendShapeChannel* bsc, const AnimationCurveNode* node) {
            std::vector<const Connection*> bscConnections = doc.GetConnectionsBySourceSequenced(bsc->ID(), "Deformer");
            for (const Connection* bscConnection : bscConnections) {
                auto bs = dynamic_cast<const BlendShape*>(bscConnection->DestinationObject());
                if (bs) {
                    auto channelIt = std::find(bs->BlendShapeChannels().begin(), bs->BlendShapeChannels().end(), bsc);
                    if (channelIt != bs->BlendShapeChannels().end()) {
                        auto channelIndex = static_cast<unsigned int>(std::distance(bs->BlendShapeChannels().begin(), channelIt));
                        std::vector<const Connection*> bsConnections = doc.GetConnectionsBySourceSequenced(bs->ID(), "Geometry");
                        for (const Connection* bsConnection : bsConnections) {
                            auto geo = dynamic_cast<const Geometry*>(bsConnection->DestinationObject());
                            if (geo) {
                                std::vector<const Connection*> geoConnections = doc.GetConnectionsBySourceSequenced(geo->ID(), "Model");
                                for (const Connection* geoConnection : geoConnections) {
                                    auto model = dynamic_cast<const Model*>(geoConnection->DestinationObject());
                                    if (model) {
                                        auto geoIt = std::find(model->GetGeometry().begin(), model->GetGeometry().end(), geo);
                                        auto geoIndex = static_cast<unsigned int>(std::distance(model->GetGeometry().begin(), geoIt));
                                        auto name = aiString(FixNodeName(model->Name() + "*"));
                                        name.length = 1 + ASSIMP_itoa10(name.data + name.length, MAXLEN - 1, geoIndex);
                                        morphAnimData* animData;
                                        auto animIt = morphAnimDatas->find(name.C_Str());
                                        if (animIt == morphAnimDatas->end()) {
                                            animData = new morphAnimData();
                                            morphAnimDatas->insert(std::make_pair(name.C_Str(), animData));
                                        }
                                        else {
                                            animData = animIt->second;
                                        }
                                        for (std::pair<std::string, const AnimationCurve*> curvesIt : node->Curves()) {
                                            if (curvesIt.first == "d|DeformPercent") {
                                                const AnimationCurve* animationCurve = curvesIt.second;
                                                const KeyTimeList& keys = animationCurve->GetKeys();
                                                const KeyValueList& values = animationCurve->GetValues();
                                                unsigned int k = 0;
                                                for (auto key : keys) {
                                                    morphKeyData* keyData;
                                                    auto keyIt = animData->find(key);
                                                    if (keyIt == animData->end()) {
                                                        keyData = new morphKeyData();
                                                        animData->insert(std::make_pair(key, keyData));
                                                    }
                                                    else {
                                                        keyData = keyIt->second;
                                                    }
                                                    keyData->values.push_back(channelIndex);
                                                    keyData->weights.push_back(values.at(k) / 100.0f);
                                                    k++;
                                                }
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }